

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int wally_confidential_addr_from_addr
              (char *address,uint32_t prefix,uchar *pub_key,size_t pub_key_len,char **output)

{
  int iVar1;
  size_t written;
  uchar buf [59];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar1 = -2;
  if ((address != (char *)0x0) &&
     ((pub_key_len == 0x21 && output != (char **)0x0) && (pub_key != (uchar *)0x0 && prefix < 0x100)
     )) {
    iVar1 = wally_base58_to_bytes(address,1,buf + 0x22,0x19,&written);
    if (iVar1 == 0) {
      if (written == 0x15) {
        buf[1] = buf[0x22];
        buf[0x22] = pub_key[0x20];
        buf._2_8_ = *(undefined8 *)pub_key;
        buf._10_8_ = *(undefined8 *)(pub_key + 8);
        buf._18_8_ = *(undefined8 *)(pub_key + 0x10);
        buf._26_8_ = *(undefined8 *)(pub_key + 0x18);
        buf[0] = (uchar)prefix;
        iVar1 = wally_base58_from_bytes(buf,0x37,1,output);
      }
      else {
        iVar1 = -2;
      }
    }
    wally_clear(buf,0x3b);
  }
  return iVar1;
}

Assistant:

int wally_confidential_addr_from_addr(
    const char *address,
    uint32_t prefix,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    unsigned char buf[2 + EC_PUBLIC_KEY_LEN + HASH160_LEN + BASE58_CHECKSUM_LEN];
    unsigned char *addr_bytes_p = &buf[EC_PUBLIC_KEY_LEN + 1];
    size_t written;
    int ret;

    if (output)
        *output = NULL;

    if (!address || (prefix & 0xffffff00) || !pub_key || pub_key_len != EC_PUBLIC_KEY_LEN || !output)
        return WALLY_EINVAL;

    /* Decode the passed address */
    ret = wally_base58_to_bytes(address, BASE58_FLAG_CHECKSUM,
                                addr_bytes_p, 1 + HASH160_LEN + BASE58_CHECKSUM_LEN, &written);
    if (ret == WALLY_OK) {
        if (written != HASH160_LEN + 1)
            ret = WALLY_EINVAL;
        else {
            /* Copy the prefix/version/pubkey and encode the address to return */
            buf[0] = prefix & 0xff;
            buf[1] = addr_bytes_p[0];
            memcpy(buf + 2, pub_key, pub_key_len);
            ret = wally_base58_from_bytes(buf, sizeof(buf) - BASE58_CHECKSUM_LEN,
                                          BASE58_FLAG_CHECKSUM, output);
        }
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}